

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

Am_Object gen_value_script_list_or_value
                    (char *line,Am_Object *group,Am_Object *cmd,Am_Value *v,Am_Slot_Key slot,
                    bool output_eq,bool output_slot_name)

{
  Am_Slot_Key in_value;
  ostream *poVar1;
  undefined7 in_register_00000089;
  byte in_stack_00000010;
  uint in_stack_fffffffffffffde4;
  Am_Am_Slot_Key local_1b0;
  char local_1ad;
  char placeholder_char;
  Am_Object local_1a0;
  ostrstream oss3;
  bool output_slot_name_local;
  bool output_eq_local;
  Am_Slot_Key slot_local;
  Am_Value *v_local;
  Am_Object *cmd_local;
  Am_Object *group_local;
  char *line_local;
  Am_Object *script_line_part;
  
  in_value = (Am_Slot_Key)CONCAT71(in_register_00000089,output_eq);
  std::ostrstream::ostrstream((ostrstream *)&local_1a0,(char *)group,300,_S_out);
  reset_ostrstream((ostrstream *)&local_1a0);
  if (output_slot_name) {
    local_1ad = find_placeholder_char((Am_Object *)v,0x169);
    if (local_1ad != '\0') {
      poVar1 = std::operator<<((ostream *)&local_1a0," ");
      poVar1 = std::operator<<(poVar1,local_1ad);
      std::operator<<(poVar1,":");
    }
    std::operator<<((ostream *)&local_1a0," :");
  }
  if ((in_stack_00000010 & 1) != 0) {
    poVar1 = std::operator<<((ostream *)&local_1a0," ");
    Am_Am_Slot_Key::Am_Am_Slot_Key(&local_1b0,in_value);
    poVar1 = operator<<(poVar1,&local_1b0);
    std::operator<<(poVar1,"=");
  }
  gen_script_list_or_value
            (line,(ostrstream *)group,&local_1a0,&Am_Script_Line_Value,cmd,v,SUB21(slot,0),
             (Am_Object *)((ulong)in_stack_fffffffffffffde4 << 0x20),(Am_Value_List *)cmd);
  Am_Object::Set((Am_Object *)line,0xb8,(uint)in_value,1);
  std::ostrstream::~ostrstream((ostrstream *)&local_1a0);
  return (Am_Object)(Am_Object_Data *)line;
}

Assistant:

Am_Object
gen_value_script_list_or_value(char *line, Am_Object &group, Am_Object &cmd,
                               Am_Value &v, Am_Slot_Key slot, bool output_eq,
                               bool output_slot_name)
{
  OSTRSTREAM_CONSTR(oss3, line, 300, std::ios::out);
  reset_ostrstream(oss3); // go to the beginning
  if (output_eq) {
    char placeholder_char = find_placeholder_char(cmd, Am_VALUE);
    if (placeholder_char)
      oss3 << " " << placeholder_char << ":";
    oss3 << " :";
  }
  if (output_slot_name) {
    oss3 << " " << Am_Am_Slot_Key(slot) << "=";
  }
  Am_Object script_line_part =
      gen_script_list_or_value(line, oss3, Am_Script_Line_Value, group, cmd, v,
                               false, group, Am_No_Value_List);
  script_line_part.Set(Am_SLOTS_TO_SAVE, slot, Am_OK_IF_NOT_THERE);
  return script_line_part;
}